

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O0

SquareMatrix<double> * __thiscall
qclab::dense::SquareMatrix<double>::operator-=(SquareMatrix<double> *this,SquareMatrix<double> *rhs)

{
  double dVar1;
  int64_t iVar2;
  double *pdVar3;
  long local_28;
  int64_t i;
  int64_t j;
  SquareMatrix<double> *rhs_local;
  SquareMatrix<double> *this_local;
  
  iVar2 = size(rhs);
  if (iVar2 == this->size_) {
    for (i = 0; i < this->size_; i = i + 1) {
      for (local_28 = 0; local_28 < this->size_; local_28 = local_28 + 1) {
        pdVar3 = operator()(rhs,local_28,i);
        dVar1 = *pdVar3;
        pdVar3 = operator()(this,local_28,i);
        *pdVar3 = *pdVar3 - dVar1;
      }
    }
    return this;
  }
  __assert_fail("rhs.size() == size_",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/SquareMatrix.hpp"
                ,0xa4,
                "SquareMatrix<T> &qclab::dense::SquareMatrix<double>::operator-=(const SquareMatrix<T> &) [T = double]"
               );
}

Assistant:

inline SquareMatrix< T >& operator-=( const SquareMatrix< T >& rhs ) {
          assert( rhs.size() == size_ ) ;
          #pragma omp parallel for
          for ( int64_t j = 0; j < size_; j++ ) {
            for ( int64_t i = 0; i < size_; i++ ) {
              (*this)(i,j) -= rhs(i,j) ;
            }
          }
          return *this ;
        }